

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xml.c
# Opt level: O3

int lyxml_print_file(FILE *stream,lyxml_elem *elem,int options)

{
  int iVar1;
  undefined1 local_28 [8];
  lyout out;
  
  iVar1 = 0;
  if (elem != (lyxml_elem *)0x0 && stream != (FILE *)0x0) {
    local_28._0_4_ = LYOUT_STREAM;
    out._0_8_ = stream;
    if ((options & 0x10U) == 0) {
      iVar1 = dump_elem((lyout *)local_28,elem,0,options,1);
    }
    else {
      iVar1 = dump_siblings((lyout *)local_28,elem,options);
    }
  }
  return iVar1;
}

Assistant:

API int
lyxml_print_file(FILE *stream, const struct lyxml_elem *elem, int options)
{
    struct lyout out;

    if (!stream || !elem) {
        return 0;
    }

    out.type = LYOUT_STREAM;
    out.method.f = stream;

    if (options & LYXML_PRINT_SIBLINGS) {
        return dump_siblings(&out, elem, options);
    } else {
        return dump_elem(&out, elem, 0, options, 1);
    }
}